

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O0

int __thiscall ncnn::Layer_final::load_param(Layer_final *this,ParamDict *pd)

{
  int iVar1;
  undefined8 in_RSI;
  Layer_final *in_RDI;
  int ret;
  
  set_layer_properties(in_RDI);
  iVar1 = (*in_RDI->layer_cpu->_vptr_Layer[2])(in_RDI->layer_cpu,in_RSI);
  get_layer_properties(in_RDI);
  return iVar1;
}

Assistant:

virtual int load_param(const ParamDict& pd)
    {
        set_layer_properties();
#if NCNN_VULKAN
        if (layer_vulkan)
        {
            if (vkdev)
            {
                int ret = layer_vulkan->load_param(pd);
                get_layer_properties();

                if (layer_vulkan->support_vulkan)
                    return ret;
            }

            // fallback to cpu layer
            delete layer_vulkan;
            layer_vulkan = 0;
        }
#endif // NCNN_VULKAN

        int ret = layer_cpu->load_param(pd);
        get_layer_properties();
        return ret;
    }